

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void JS_AddIntrinsicTypedArrays(JSContext *ctx)

{
  int iVar1;
  JSValue *pJVar2;
  JSValue JVar3;
  ulong uVar4;
  char *name;
  JSAtom atom;
  long lVar5;
  long lVar6;
  JSValue JVar7;
  JSValue JVar8;
  JSValue obj;
  JSValue val;
  JSValue proto;
  JSValue val_00;
  char buf [64];
  JSValueUnion local_b8;
  JSValueUnion local_88;
  JSValueUnion local_78 [9];
  
  pJVar2 = ctx->class_proto;
  JVar7 = JS_NewObjectProtoClass(ctx,pJVar2[1],1);
  pJVar2[0x13] = JVar7;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x13],js_array_buffer_proto_funcs,3);
  JVar7 = ctx->class_proto[0x13];
  JVar8 = JS_NewCFunction3(ctx,js_array_buffer_constructor,"ArrayBuffer",1,JS_CFUNC_constructor,0,
                           ctx->function_proto);
  JS_NewGlobalCConstructor2(ctx,JVar8,"ArrayBuffer",JVar7);
  JS_SetPropertyFunctionList(ctx,JVar8,js_array_buffer_funcs,2);
  pJVar2 = ctx->class_proto;
  JVar7 = JS_NewObjectProtoClass(ctx,pJVar2[1],1);
  pJVar2[0x14] = JVar7;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x14],js_shared_array_buffer_proto_funcs,3);
  JVar7 = ctx->class_proto[0x14];
  JVar8 = JS_NewCFunction3(ctx,js_shared_array_buffer_constructor,"SharedArrayBuffer",1,
                           JS_CFUNC_constructor,0,ctx->function_proto);
  JS_NewGlobalCConstructor2(ctx,JVar8,"SharedArrayBuffer",JVar7);
  JS_SetPropertyFunctionList(ctx,JVar8,js_shared_array_buffer_funcs,1);
  JVar8 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
  JS_SetPropertyFunctionList(ctx,JVar8,js_typed_array_base_proto_funcs,0x1e);
  JVar7 = JS_GetPropertyInternal(ctx,ctx->class_proto[2],0x37,ctx->class_proto[2],0);
  JS_DefinePropertyValue(ctx,JVar8,0x37,JVar7,3);
  obj = JS_NewCFunction3(ctx,js_typed_array_base_constructor,"TypedArray",0,JS_CFUNC_generic,0,
                         ctx->function_proto);
  JS_SetPropertyFunctionList(ctx,obj,js_typed_array_base_funcs,3);
  JS_SetConstructor2(ctx,obj,JVar8,0,3);
  lVar6 = 0x158;
  lVar5 = 0;
  JVar7 = JVar8;
  do {
    local_b8 = JVar7.u;
    JVar3.tag = JVar8.tag;
    JVar3.u.ptr = local_b8.ptr;
    pJVar2 = ctx->class_proto;
    JVar7 = JS_NewObjectProtoClass(ctx,JVar7,1);
    *(JSValueUnion *)((long)pJVar2 + lVar6 + -8) = JVar7.u;
    *(int64_t *)((long)&pJVar2->u + lVar6) = JVar7.tag;
    uVar4 = 1L << (""[lVar5] & 0x3f);
    atom = 0x17e4b1;
    JVar7.tag = *(int64_t *)((long)&ctx->class_proto->u + lVar6);
    JVar7.u.ptr = ((JSValueUnion *)((long)ctx->class_proto + lVar6 + -8))->ptr;
    val.tag = 0;
    val.u.ptr = (void *)uVar4;
    JS_DefinePropertyValueStr(ctx,JVar7,"BYTES_PER_ELEMENT",val,0);
    name = JS_AtomGetStrRT(ctx->rt,(char *)&local_78[0].int32,(int)lVar5 + 0xa0,atom);
    local_88 = obj.u;
    JVar7 = JS_NewCFunction3(ctx,js_typed_array_constructor,name,3,JS_CFUNC_constructor_magic,
                             (int)lVar5 + 0x15,obj);
    proto.tag = *(int64_t *)((long)&ctx->class_proto->u + lVar6);
    proto.u.ptr = ((JSValueUnion *)((long)ctx->class_proto + lVar6 + -8))->ptr;
    JS_NewGlobalCConstructor2(ctx,JVar7,name,proto);
    val_00.tag = 0;
    val_00.u.ptr = (void *)uVar4;
    JS_DefinePropertyValueStr(ctx,JVar7,"BYTES_PER_ELEMENT",val_00,0);
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + 0x10;
    JVar7 = JVar3;
  } while (lVar5 != 9);
  local_78[0].float64 = local_b8.float64;
  if ((0xfffffff4 < (uint)JVar8.tag) &&
     (iVar1 = *local_b8.ptr, *(int *)local_b8.ptr = iVar1 + -1, iVar1 < 2)) {
    JVar8.u.ptr = local_b8.ptr;
    __JS_FreeValueRT(ctx->rt,JVar8);
  }
  local_78[0].float64 = local_88.float64;
  if ((0xfffffff4 < (uint)obj.tag) &&
     (iVar1 = *local_88.ptr, *(int *)local_88.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,obj);
  }
  pJVar2 = ctx->class_proto;
  JVar7 = JS_NewObjectProtoClass(ctx,pJVar2[1],1);
  pJVar2[0x1e] = JVar7;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x1e],js_dataview_proto_funcs,0x14);
  JVar7 = ctx->class_proto[0x1e];
  JVar8 = JS_NewCFunction3(ctx,js_dataview_constructor,"DataView",1,JS_CFUNC_constructor,0,
                           ctx->function_proto);
  JS_NewGlobalCConstructor2(ctx,JVar8,"DataView",JVar7);
  JS_SetPropertyFunctionList(ctx,ctx->global_obj,js_atomics_obj,1);
  return;
}

Assistant:

void JS_AddIntrinsicTypedArrays(JSContext *ctx)
{
    JSValue typed_array_base_proto, typed_array_base_func;
    JSValueConst array_buffer_func, shared_array_buffer_func;
    int i;

    ctx->class_proto[JS_CLASS_ARRAY_BUFFER] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_ARRAY_BUFFER],
                               js_array_buffer_proto_funcs,
                               countof(js_array_buffer_proto_funcs));

    array_buffer_func = JS_NewGlobalCConstructorOnly(ctx, "ArrayBuffer",
                                                 js_array_buffer_constructor, 1,
                                                 ctx->class_proto[JS_CLASS_ARRAY_BUFFER]);
    JS_SetPropertyFunctionList(ctx, array_buffer_func,
                               js_array_buffer_funcs,
                               countof(js_array_buffer_funcs));

    ctx->class_proto[JS_CLASS_SHARED_ARRAY_BUFFER] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_SHARED_ARRAY_BUFFER],
                               js_shared_array_buffer_proto_funcs,
                               countof(js_shared_array_buffer_proto_funcs));

    shared_array_buffer_func = JS_NewGlobalCConstructorOnly(ctx, "SharedArrayBuffer",
                                                 js_shared_array_buffer_constructor, 1,
                                                 ctx->class_proto[JS_CLASS_SHARED_ARRAY_BUFFER]);
    JS_SetPropertyFunctionList(ctx, shared_array_buffer_func,
                               js_shared_array_buffer_funcs,
                               countof(js_shared_array_buffer_funcs));

    typed_array_base_proto = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, typed_array_base_proto,
                               js_typed_array_base_proto_funcs,
                               countof(js_typed_array_base_proto_funcs));

    /* TypedArray.prototype.toString must be the same object as Array.prototype.toString */
    JSValue obj = JS_GetProperty(ctx, ctx->class_proto[JS_CLASS_ARRAY], JS_ATOM_toString);
    /* XXX: should use alias method in JSCFunctionListEntry */ //@@@
    JS_DefinePropertyValue(ctx, typed_array_base_proto, JS_ATOM_toString, obj,
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);

    typed_array_base_func = JS_NewCFunction(ctx, js_typed_array_base_constructor,
                                            "TypedArray", 0);
    JS_SetPropertyFunctionList(ctx, typed_array_base_func,
                               js_typed_array_base_funcs,
                               countof(js_typed_array_base_funcs));
    JS_SetConstructor(ctx, typed_array_base_func, typed_array_base_proto);

    for(i = JS_CLASS_UINT8C_ARRAY; i < JS_CLASS_UINT8C_ARRAY + JS_TYPED_ARRAY_COUNT; i++) {
        JSValue func_obj;
        char buf[ATOM_GET_STR_BUF_SIZE];
        const char *name;

        ctx->class_proto[i] = JS_NewObjectProto(ctx, typed_array_base_proto);
        JS_DefinePropertyValueStr(ctx, ctx->class_proto[i],
                                  "BYTES_PER_ELEMENT",
                                  JS_NewInt32(ctx, 1 << typed_array_size_log2(i)),
                                  0);
        name = JS_AtomGetStr(ctx, buf, sizeof(buf),
                             JS_ATOM_Uint8ClampedArray + i - JS_CLASS_UINT8C_ARRAY);
        func_obj = JS_NewCFunction3(ctx, (JSCFunction *)js_typed_array_constructor,
                                    name, 3, JS_CFUNC_constructor_magic, i,
                                    typed_array_base_func);
        JS_NewGlobalCConstructor2(ctx, func_obj, name, ctx->class_proto[i]);
        JS_DefinePropertyValueStr(ctx, func_obj,
                                  "BYTES_PER_ELEMENT",
                                  JS_NewInt32(ctx, 1 << typed_array_size_log2(i)),
                                  0);
    }
    JS_FreeValue(ctx, typed_array_base_proto);
    JS_FreeValue(ctx, typed_array_base_func);

    /* DataView */
    ctx->class_proto[JS_CLASS_DATAVIEW] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_DATAVIEW],
                               js_dataview_proto_funcs,
                               countof(js_dataview_proto_funcs));
    JS_NewGlobalCConstructorOnly(ctx, "DataView",
                                 js_dataview_constructor, 1,
                                 ctx->class_proto[JS_CLASS_DATAVIEW]);
    /* Atomics */
#ifdef CONFIG_ATOMICS
    JS_AddIntrinsicAtomics(ctx);
#endif
}